

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_duplicates(lyd_node *first,lyd_node *node,uint32_t val_opts)

{
  LY_ERR LVar1;
  bool bVar2;
  ly_bool fail;
  lyd_node *plStack_20;
  uint32_t val_opts_local;
  lyd_node *node_local;
  lyd_node *first_local;
  
  bVar2 = false;
  plStack_20 = node;
  node_local = first;
  if ((node->flags & 4) == 0) {
    __assert_fail("node->flags & LYD_NEW",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x235,
                  "LY_ERR lyd_validate_duplicates(const struct lyd_node *, const struct lyd_node *, uint32_t)"
                 );
  }
  if ((node->schema == (lysc_node *)0x0) ||
     (((node->schema->nodetype != 0x10 || ((node->schema->flags & 0x200) == 0)) &&
      ((node->schema->nodetype != 8 || ((node->schema->flags & 1) != 0)))))) {
    if ((node->parent == (lyd_node_inner *)0x0) || (node->parent->children_ht == (ly_ht *)0x0)) {
      for (; node_local != (lyd_node *)0x0; node_local = node_local->next) {
        if (node_local != plStack_20) {
          if ((plStack_20->schema->nodetype & 100) == 0) {
            LVar1 = lyd_compare_single(node_local,plStack_20,0);
            if (LVar1 == LY_SUCCESS) {
              bVar2 = true;
              break;
            }
          }
          else if (node_local->schema == plStack_20->schema) {
            bVar2 = true;
            break;
          }
        }
      }
    }
    else {
      LVar1 = lyht_find_next_with_collision_cb
                        (node->parent->children_ht,&stack0xffffffffffffffe0,node->hash,
                         lyd_val_dup_val_equal,(void **)0x0);
      bVar2 = LVar1 == LY_SUCCESS;
    }
    if (bVar2) {
      if (((plStack_20->schema->nodetype & 0x18) == 0) || ((val_opts & 8) == 0)) {
        ly_log_location((lysc_node *)0x0,plStack_20,(char *)0x0,(ly_in *)0x0);
        ly_vlog(plStack_20->schema->module->ctx,(char *)0x0,LYVE_DATA,
                "Duplicate instance of \"%s\".",plStack_20->schema->name);
        ly_log_location_revert(0,1,0,0);
        return LY_EVALID;
      }
      ly_log_location((lysc_node *)0x0,plStack_20,(char *)0x0,(ly_in *)0x0);
      ly_log(plStack_20->schema->module->ctx,LY_LLWRN,LY_SUCCESS,"Duplicate instance of \"%s\".",
             plStack_20->schema->name);
      ly_log_location_revert(0,1,0,0);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_validate_duplicates(const struct lyd_node *first, const struct lyd_node *node, uint32_t val_opts)
{
    ly_bool fail = 0;

    assert(node->flags & LYD_NEW);

    /* key-less list or non-configuration leaf-list */
    if (lysc_is_dup_inst_list(node->schema)) {
        /* duplicate instances allowed */
        return LY_SUCCESS;
    }

    /* find exactly the same next instance using hashes if possible */
    if (node->parent && node->parent->children_ht) {
        /* because of the callback used, an instance must always be found (pointer may or may not be equal to node),
         * so if we find another instance, there is a duplicate */
        if (!lyht_find_next_with_collision_cb(node->parent->children_ht, &node, node->hash, lyd_val_dup_val_equal, NULL)) {
            fail = 1;
        }
    } else {
        for ( ; first; first = first->next) {
            if (first == node) {
                continue;
            }

            if (node->schema->nodetype & (LYD_NODE_ANY | LYS_LEAF)) {
                if (first->schema == node->schema) {
                    fail = 1;
                    break;
                }
            } else if (!lyd_compare_single(first, node, 0)) {
                fail = 1;
                break;
            }
        }
    }

    if (fail) {
        if ((node->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) && (val_opts & LYD_VALIDATE_OPERATIONAL)) {
            /* only a warning */
            LOG_LOCSET(NULL, node);
            LOGWRN(node->schema->module->ctx, "Duplicate instance of \"%s\".", node->schema->name);
            LOG_LOCBACK(0, 1);
        } else {
            LOG_LOCSET(NULL, node);
            LOGVAL(node->schema->module->ctx, LY_VCODE_DUP, node->schema->name);
            LOG_LOCBACK(0, 1);
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}